

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

uint __thiscall cmCTestGIT::GetGitVersion(cmCTestGIT *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uStack_108;
  uint v [4];
  undefined1 local_f0 [8];
  OutputLogger version_err;
  undefined1 local_a0 [8];
  OneLineParser version_out;
  string version;
  char *git_version [3];
  char *git;
  cmCTestGIT *this_local;
  
  if (this->CurrentGitVersion == 0) {
    version.field_2._8_8_ = std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)&version_out.Line1);
    OneLineParser::OneLineParser
              ((OneLineParser *)local_a0,this,"version-out> ",(string *)&version_out.Line1);
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_f0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "version-err> ");
    uStack_108 = 0;
    v[0] = 0;
    v[1] = 0;
    bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,(char **)((long)&version.field_2 + 8),
                                (OutputParser *)local_a0,(OutputParser *)local_f0,(char *)0x0,Auto);
    if (bVar1) {
      uVar4 = std::__cxx11::string::c_str();
      iVar2 = __isoc99_sscanf(uVar4,"git version %u.%u.%u.%u",&uStack_108,(long)&uStack_108 + 4,v,
                              v + 1);
      if (2 < iVar2) {
        uVar3 = cmCTestGITVersion((uint)uStack_108,uStack_108._4_4_,v[0],v[1]);
        this->CurrentGitVersion = uVar3;
      }
    }
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_f0);
    OneLineParser::~OneLineParser((OneLineParser *)local_a0);
    std::__cxx11::string::~string((string *)&version_out.Line1);
  }
  return this->CurrentGitVersion;
}

Assistant:

unsigned int cmCTestGIT::GetGitVersion()
{
  if (!this->CurrentGitVersion) {
    const char* git = this->CommandLineTool.c_str();
    char const* git_version[] = { git, "--version", nullptr };
    std::string version;
    OneLineParser version_out(this, "version-out> ", version);
    OutputLogger version_err(this->Log, "version-err> ");
    unsigned int v[4] = { 0, 0, 0, 0 };
    if (this->RunChild(git_version, &version_out, &version_err) &&
        sscanf(version.c_str(), "git version %u.%u.%u.%u", &v[0], &v[1], &v[2],
               &v[3]) >= 3) {
      this->CurrentGitVersion = cmCTestGITVersion(v[0], v[1], v[2], v[3]);
    }
  }
  return this->CurrentGitVersion;
}